

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecode.c
# Opt level: O2

uint8_t sysbvm_bytecodeInterpreter_destinationOperandCountForOpcode(uint8_t opcode)

{
  int iVar1;
  undefined7 in_register_00000039;
  
  iVar1 = (int)CONCAT71(in_register_00000039,opcode);
  if ((((0x30 < iVar1 - 0x20U) || ((0x1000106df000fU >> ((ulong)(iVar1 - 0x20U) & 0x3f) & 1) == 0))
      && ((0x30 < iVar1 - 0x60U || ((0x1000100010001U >> ((ulong)(iVar1 - 0x60U) & 0x3f) & 1) == 0))
         )) && ((0x20 < iVar1 - 0xa0U ||
                ((0x100010001U >> ((ulong)(iVar1 - 0xa0U) & 0x3f) & 1) == 0)))) {
    return '\0';
  }
  return '\x01';
}

Assistant:

SYSBVM_API uint8_t sysbvm_bytecodeInterpreter_destinationOperandCountForOpcode(uint8_t opcode)
{
    switch(opcode)
    {
    case SYSBVM_OPCODE_ALLOCA:
    case SYSBVM_OPCODE_MOVE:
    case SYSBVM_OPCODE_LOAD:
    case SYSBVM_OPCODE_LOAD_SYMBOL_VALUE_BINDING:
    case SYSBVM_OPCODE_ALLOCA_WITH_VALUE:
    case SYSBVM_OPCODE_COERCE_VALUE:
    case SYSBVM_OPCODE_DOWNCAST_VALUE:
    case SYSBVM_OPCODE_UNCHECKED_DOWNCAST_VALUE:
    case SYSBVM_OPCODE_MAKE_ASSOCIATION:
    case SYSBVM_OPCODE_SLOT_AT:
    case SYSBVM_OPCODE_SLOT_REFERENCE_AT:
    case SYSBVM_OPCODE_REF_SLOT_AT:
    case SYSBVM_OPCODE_REF_SLOT_REFERENCE_AT:
    case SYSBVM_OPCODE_CALL:
    case SYSBVM_OPCODE_UNCHECKED_CALL:
    case SYSBVM_OPCODE_SEND:
    case SYSBVM_OPCODE_SEND_WITH_LOOKUP:
    case SYSBVM_OPCODE_MAKE_ARRAY_WITH_ELEMENTS:
    case SYSBVM_OPCODE_MAKE_BYTE_ARRAY_WITH_ELEMENTS:
    case SYSBVM_OPCODE_MAKE_CLOSURE_WITH_CAPTURES:
    case SYSBVM_OPCODE_MAKE_DICTIONARY_WITH_ELEMENTS:
    case SYSBVM_OPCODE_MAKE_TUPLE_WITH_ELEMENTS:
        return 1;
    default:
        return 0;
    }
}